

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_shared_mutex.hpp
# Opt level: O0

void __thiscall
yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::unlock_shared
          (shared_mutex_base<yamc::rwlock::ReaderPrefer> *this)

{
  bool bVar1;
  system_error *this_00;
  error_code eVar2;
  __normal_iterator<std::thread::id_*,_std::vector<std::thread::id,_std::allocator<std::thread::id>_>_>
  local_78;
  const_iterator local_70;
  const_iterator local_68;
  id *local_60;
  __normal_iterator<std::thread::id_*,_std::vector<std::thread::id,_std::allocator<std::thread::id>_>_>
  local_58;
  __normal_iterator<std::thread::id_*,_std::vector<std::thread::id,_std::allocator<std::thread::id>_>_>
  local_50;
  __normal_iterator<std::thread::id_*,_std::vector<std::thread::id,_std::allocator<std::thread::id>_>_>
  result;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lk;
  id tid;
  shared_mutex_base<yamc::rwlock::ReaderPrefer> *this_local;
  
  lk._M_device = (mutex_type *)std::this_thread::get_id();
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mtx_);
  bVar1 = is_shared_owner(this,(id)lk._M_device);
  if (bVar1) {
    bVar1 = rwlock::ReaderPrefer::release_rlock(&this->state_);
    if (bVar1) {
      std::condition_variable::notify_all();
    }
    local_58._M_current =
         (id *)std::vector<std::thread::id,_std::allocator<std::thread::id>_>::begin
                         (&this->s_owner_);
    local_60 = (id *)std::vector<std::thread::id,_std::allocator<std::thread::id>_>::end
                               (&this->s_owner_);
    local_50 = std::
               remove<__gnu_cxx::__normal_iterator<std::thread::id*,std::vector<std::thread::id,std::allocator<std::thread::id>>>,std::thread::id>
                         (local_58,(__normal_iterator<std::thread::id_*,_std::vector<std::thread::id,_std::allocator<std::thread::id>_>_>
                                    )local_60,(id *)&lk);
    __gnu_cxx::
    __normal_iterator<std::thread::id_const*,std::vector<std::thread::id,std::allocator<std::thread::id>>>
    ::__normal_iterator<std::thread::id*>
              ((__normal_iterator<std::thread::id_const*,std::vector<std::thread::id,std::allocator<std::thread::id>>>
                *)&local_68,&local_50);
    local_78._M_current =
         (id *)std::vector<std::thread::id,_std::allocator<std::thread::id>_>::end(&this->s_owner_);
    __gnu_cxx::
    __normal_iterator<std::thread::id_const*,std::vector<std::thread::id,std::allocator<std::thread::id>>>
    ::__normal_iterator<std::thread::id*>
              ((__normal_iterator<std::thread::id_const*,std::vector<std::thread::id,std::allocator<std::thread::id>>>
                *)&local_70,&local_78);
    std::vector<std::thread::id,_std::allocator<std::thread::id>_>::erase
              (&this->s_owner_,local_68,local_70);
    validator::deadlock::unlocked((uintptr_t)this,(id)lk._M_device,true);
    std::lock_guard<std::mutex>::~lock_guard(&local_20);
    return;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  eVar2 = std::make_error_code(operation_not_permitted);
  result._M_current._0_4_ = eVar2._M_value;
  eVar2._4_4_ = 0;
  eVar2._M_value = (uint)result._M_current;
  std::system_error::system_error(this_00,eVar2,"invalid unlock_shared");
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void unlock_shared()
  {
    const auto tid = std::this_thread::get_id();
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    if (!is_shared_owner(tid)) {
      // owner thread
#if YAMC_CHECKED_CALL_ABORT
      std::abort();
#else
      throw std::system_error(std::make_error_code(std::errc::operation_not_permitted), "invalid unlock_shared");
#endif
    }
    if (RwLockPolicy::release_rlock(state_)) {
      cv_.notify_all();
    }
    auto result = std::remove(s_owner_.begin(), s_owner_.end(), tid);
    s_owner_.erase(result, s_owner_.end());
    validator::unlocked(reinterpret_cast<uintptr_t>(this), tid, true);
  }